

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O3

_Bool wb_tree_verify(wb_tree *tree)

{
  wb_node *node;
  size_t sVar1;
  _Bool _Var2;
  uint root_weight;
  uint local_4;
  
  node = tree->root;
  sVar1 = tree->count;
  if (node == (wb_node *)0x0) {
    if (sVar1 == 0) {
LAB_00106ac6:
      _Var2 = node_verify(tree,(wb_node *)0x0,node,&local_4);
      return _Var2;
    }
    wb_tree_verify_cold_3();
  }
  else if (sVar1 == 0) {
    wb_tree_verify_cold_2();
  }
  else {
    if (sVar1 + 1 == (ulong)node->weight) goto LAB_00106ac6;
    wb_tree_verify_cold_1();
  }
  return false;
}

Assistant:

bool
wb_tree_verify(const wb_tree* tree)
{
    if (tree->root) {
	VERIFY(tree->count > 0);
	VERIFY(tree->count + 1 == tree->root->weight);
    } else {
	VERIFY(tree->count == 0);
    }
    unsigned root_weight;
    return node_verify(tree, NULL, tree->root, &root_weight);
}